

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

commonNaNT * floatx80ToCommonNaN(commonNaNT *__return_storage_ptr__,floatx80 a,float_status *status)

{
  flag fVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  
  uVar2 = a.low;
  if ((((~a._8_4_ & 0x7fff) == 0) &&
      (((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0)) &&
     (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  fVar1 = '\x01';
  if ((long)uVar2 < 0) {
    fVar1 = (flag)((a._8_8_ & 0xffff) >> 0xf);
  }
  uVar3 = 0x8000000000000000;
  if ((long)uVar2 < 0) {
    uVar3 = uVar2 * 2;
  }
  __return_storage_ptr__->sign = fVar1;
  __return_storage_ptr__->low = 0;
  __return_storage_ptr__->high = uVar3;
  return __return_storage_ptr__;
}

Assistant:

static commonNaNT floatx80ToCommonNaN(floatx80 a, float_status *status)
{
    floatx80 dflt;
    commonNaNT z;

    if (floatx80_is_signaling_nan(a, status)) {
        float_raise(float_flag_invalid, status);
    }
    if (a.low >> 63) {
        z.sign = a.high >> 15;
        z.low = 0;
        z.high = a.low << 1;
    } else {
        dflt = floatx80_default_nan(status);
        z.sign = dflt.high >> 15;
        z.low = 0;
        z.high = dflt.low << 1;
    }
    return z;
}